

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O3

void __thiscall vector<server::teamkillkick>::growbuf(vector<server::teamkillkick> *this,int sz)

{
  uint uVar1;
  teamkillkick *__src;
  uint uVar2;
  teamkillkick *__dest;
  
  uVar1 = this->alen;
  if ((ulong)uVar1 == 0) {
    uVar2 = 8;
    if (8 < sz) {
      uVar2 = sz;
    }
  }
  else {
    uVar2 = uVar1;
    if (sz <= (int)uVar1) {
      return;
    }
    do {
      uVar2 = uVar2 * 2;
    } while ((int)uVar2 < sz);
  }
  this->alen = uVar2;
  if ((int)uVar1 < (int)uVar2) {
    __dest = (teamkillkick *)operator_new__((long)(int)uVar2 * 0xc);
    if (0 < (int)uVar1) {
      __src = this->buf;
      memcpy(__dest,__src,(ulong)uVar1 * 0xc);
      if (__src != (teamkillkick *)0x0) {
        operator_delete__(__src);
      }
    }
    this->buf = __dest;
  }
  return;
}

Assistant:

void growbuf(int sz)
    {
        int olen = alen;
        if(!alen) alen = max(MINSIZE, sz);
        else while(alen < sz) alen *= 2;
        if(alen <= olen) return;
        uchar *newbuf = new uchar[alen*sizeof(T)];
        if(olen > 0)
        {
            memcpy(newbuf, (void *)buf, olen*sizeof(T));
            delete[] (uchar *)buf;
        }
        buf = (T *)newbuf;
    }